

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chop.cpp
# Opt level: O0

handle_t handlegraph::algorithms::concat_nodes
                   (MutablePathDeletableHandleGraph *graph,
                   vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *nodes)

{
  initializer_list<handlegraph::handle_t> __l;
  bool bVar1;
  long *plVar2;
  __tuple_element_t<0UL,_tuple<step_handle_t,_step_handle_t,_bool>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<step_handle_t,_step_handle_t,_bool>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<step_handle_t,_step_handle_t,_bool>_> *p_Var5;
  reference phVar6;
  long lVar7;
  const_reference pvVar8;
  reference phVar9;
  reference phVar10;
  handle_t hVar11;
  undefined8 in_RSI;
  long *in_RDI;
  handle_t *n_5;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2_6;
  const_iterator next_it;
  const_iterator it;
  handle_t *n_4;
  iterator __end2_5;
  iterator __begin2_5;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *__range2_5;
  handle_t *n_3;
  iterator __end2_4;
  iterator __begin2_4;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *__range2_4;
  tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool> *range;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
  *__range2_3;
  uint64_t i;
  vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
  ranges_to_rewrite;
  handle_t *n_2;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *__range2_2;
  handle_t *n_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *__range2_1;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  right_neighbors;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  left_neighbors;
  handle_t *n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  stringstream ss;
  handle_t new_node;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *in_stack_fffffffffffffaf8;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffb00;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffb10;
  allocator_type *in_stack_fffffffffffffb28;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffb30;
  long lVar12;
  iterator in_stack_fffffffffffffb38;
  anon_class_24_3_1cfe5525_conflict *in_stack_fffffffffffffb40;
  anon_class_32_4_a7c7ca01_conflict *in_stack_fffffffffffffb48;
  PathHandleGraph *in_stack_fffffffffffffb50;
  handle_t *in_stack_fffffffffffffb58;
  HandleGraph *in_stack_fffffffffffffb60;
  bool local_431;
  __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_420;
  undefined8 local_418;
  handle_t *local_410;
  __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_408;
  __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_400;
  reference local_3f8;
  _Node_iterator_base<handlegraph::handle_t,_true> local_3f0;
  _Node_iterator_base<handlegraph::handle_t,_true> local_3e8;
  undefined1 *local_3e0;
  reference local_3d8;
  _Node_iterator_base<handlegraph::handle_t,_true> local_3d0;
  _Node_iterator_base<handlegraph::handle_t,_true> local_3c8;
  undefined1 *local_3c0;
  undefined1 local_3b1 [33];
  char local_390 [8];
  char *local_388;
  undefined8 local_380;
  undefined1 local_378 [24];
  reference local_360;
  tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool> *local_358;
  __normal_iterator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_*,_std::vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>_>
  local_350;
  undefined1 *local_348;
  undefined8 local_340;
  long *local_338;
  undefined8 local_330;
  undefined1 *local_328;
  undefined1 local_320 [24];
  reference local_308;
  _Node_iterator_base<handlegraph::handle_t,_true> local_300;
  _Node_iterator_base<handlegraph::handle_t,_true> local_2f8;
  undefined1 *local_2f0;
  reference local_2e8;
  _Node_iterator_base<handlegraph::handle_t,_true> local_2e0;
  _Node_iterator_base<handlegraph::handle_t,_true> local_2d8;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  long *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  undefined1 local_2a8 [56];
  undefined8 local_270;
  undefined1 *local_268;
  char *local_260;
  long *local_258;
  undefined1 local_250 [56];
  string local_218 [36];
  char local_1f4 [8];
  string local_1e0 [32];
  reference local_1c0;
  handle_t *local_1b8;
  __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_1b0;
  undefined8 local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  undefined8 local_18;
  long *local_10;
  char local_8 [8];
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::empty
                    (in_stack_fffffffffffffb10);
  local_431 = false;
  if (!bVar1) {
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::front
              (in_stack_fffffffffffffb00);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::back
              (in_stack_fffffffffffffb00);
    local_431 = handlegraph::operator!=
                          ((handle_t *)in_stack_fffffffffffffb00,
                           (handle_t *)in_stack_fffffffffffffaf8);
  }
  if (local_431 == false) {
    __assert_fail("!nodes.empty() && nodes.front() != nodes.back()",
                  "/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/chop.cpp"
                  ,0x24,
                  "handle_t handlegraph::algorithms::concat_nodes(MutablePathDeletableHandleGraph &, const std::vector<handle_t> &)"
                 );
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8 = local_18;
  local_1b0._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                  in_stack_fffffffffffffaf8);
  local_1b8 = (handle_t *)
              std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                        ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                         in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffaf8);
    if (!bVar1) break;
    local_1c0 = __gnu_cxx::
                __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                ::operator*(&local_1b0);
    (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb0)) + 0x40))
              (local_1e0,(long)local_10 + *(long *)(*local_10 + -0xb0),local_1c0);
    std::operator<<(local_190,local_1e0);
    std::__cxx11::string::~string(local_1e0);
    __gnu_cxx::
    __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_1b0);
  }
  plVar2 = (long *)((long)local_10 + *(long *)(*local_10 + -0x1d0));
  std::__cxx11::stringstream::str();
  local_1f4 = (char  [8])(**(code **)(*plVar2 + 0xa0))(plVar2,local_218);
  local_8 = local_1f4;
  std::__cxx11::string::~string(local_218);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                   *)0x2846b7);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::front
            (in_stack_fffffffffffffb00);
  local_270 = local_18;
  local_260 = local_8;
  local_258 = local_10;
  local_268 = local_250;
  HandleGraph::
  follow_edges<handlegraph::algorithms::concat_nodes(handlegraph::MutablePathDeletableHandleGraph&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&)::__0>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             SUB81((ulong)in_stack_fffffffffffffb50 >> 0x38,0),
             (anon_class_32_4_e59ef524_conflict *)in_stack_fffffffffffffb48);
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                   *)0x284755);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::back
            (in_stack_fffffffffffffb00);
  local_2c8 = local_18;
  local_2c0 = local_10;
  local_2b0 = local_8;
  local_2b8 = local_2a8;
  HandleGraph::
  follow_edges<handlegraph::algorithms::concat_nodes(handlegraph::MutablePathDeletableHandleGraph&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&)::__1>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             SUB81((ulong)in_stack_fffffffffffffb50 >> 0x38,0),in_stack_fffffffffffffb48);
  local_2d0 = local_250;
  local_2d8._M_cur =
       (__node_type *)
       std::
       unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
       ::begin(in_stack_fffffffffffffaf8);
  local_2e0._M_cur =
       (__node_type *)
       std::
       unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
       ::end(in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_2d8,&local_2e0);
    if (!bVar1) break;
    local_2e8 = std::__detail::_Node_iterator<handlegraph::handle_t,_true,_true>::operator*
                          ((_Node_iterator<handlegraph::handle_t,_true,_true> *)0x284840);
    (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1d0)) + 0xb0))
              ((long)local_10 + *(long *)(*local_10 + -0x1d0),local_2e8,local_8);
    std::__detail::_Node_iterator<handlegraph::handle_t,_true,_true>::operator++
              ((_Node_iterator<handlegraph::handle_t,_true,_true> *)in_stack_fffffffffffffb00);
  }
  local_2f0 = local_2a8;
  local_2f8._M_cur =
       (__node_type *)
       std::
       unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
       ::begin(in_stack_fffffffffffffaf8);
  local_300._M_cur =
       (__node_type *)
       std::
       unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
       ::end(in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_2f8,&local_300);
    if (!bVar1) break;
    local_308 = std::__detail::_Node_iterator<handlegraph::handle_t,_true,_true>::operator*
                          ((_Node_iterator<handlegraph::handle_t,_true,_true> *)0x284957);
    (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1d0)) + 0xb0))
              ((long)local_10 + *(long *)(*local_10 + -0x1d0),local_8,local_308);
    std::__detail::_Node_iterator<handlegraph::handle_t,_true,_true>::operator++
              ((_Node_iterator<handlegraph::handle_t,_true,_true> *)in_stack_fffffffffffffb00);
  }
  std::
  vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
  ::vector((vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
            *)0x2849bc);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::front
            (in_stack_fffffffffffffb00);
  local_338 = local_10;
  local_330 = local_18;
  local_328 = local_320;
  PathHandleGraph::
  for_each_step_on_handle<handlegraph::algorithms::concat_nodes(handlegraph::MutablePathDeletableHandleGraph&,std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>const&)::__2>
            (in_stack_fffffffffffffb50,(handle_t *)in_stack_fffffffffffffb48,
             in_stack_fffffffffffffb40);
  local_340 = 0;
  local_348 = local_320;
  local_350._M_current =
       (tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool> *)
       std::
       vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
       ::begin((vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
                *)in_stack_fffffffffffffaf8);
  local_358 = (tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool> *)
              std::
              vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
              ::end((vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
                     *)in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_*,_std::vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_*,_std::vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>_>
                        *)in_stack_fffffffffffffaf8);
    if (!bVar1) break;
    local_360 = __gnu_cxx::
                __normal_iterator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_*,_std::vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>_>
                ::operator*(&local_350);
    plVar2 = (long *)((long)local_10 + *(long *)(*local_10 + -0x1c8));
    p_Var3 = std::get<0ul,handlegraph::step_handle_t,handlegraph::step_handle_t,bool>
                       ((tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool> *)
                        0x284acd);
    p_Var4 = std::get<1ul,handlegraph::step_handle_t,handlegraph::step_handle_t,bool>
                       ((tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool> *)
                        0x284adf);
    p_Var5 = std::get<2ul,handlegraph::step_handle_t,handlegraph::step_handle_t,bool>
                       ((tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool> *)
                        0x284af1);
    if ((*p_Var5 & 1U) == 0) {
      local_390[0] = local_8[0];
      local_390[1] = local_8[1];
      local_390[2] = local_8[2];
      local_390[3] = local_8[3];
      local_390[4] = local_8[4];
      local_390[5] = local_8[5];
      local_390[6] = local_8[6];
      local_390[7] = local_8[7];
    }
    else {
      local_390 = (char  [8])
                  (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb0)) + 0x30))
                            ((long)local_10 + *(long *)(*local_10 + -0xb0),local_8);
    }
    local_388 = local_390;
    local_380 = 1;
    std::allocator<handlegraph::handle_t>::allocator((allocator<handlegraph::handle_t> *)0x284b74);
    __l._M_len = (size_type)in_stack_fffffffffffffb40;
    __l._M_array = in_stack_fffffffffffffb38;
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
              (in_stack_fffffffffffffb30,__l,in_stack_fffffffffffffb28);
    (**(code **)(*plVar2 + 0x188))(local_3b1,plVar2,p_Var3,p_Var4,local_378);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
              (in_stack_fffffffffffffb10);
    std::allocator<handlegraph::handle_t>::~allocator((allocator<handlegraph::handle_t> *)0x284bdf);
    __gnu_cxx::
    __normal_iterator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_*,_std::vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>_>
    ::operator++(&local_350);
  }
  std::
  vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
  ::~vector((vector<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>,_std::allocator<std::tuple<handlegraph::step_handle_t,_handlegraph::step_handle_t,_bool>_>_>
             *)in_stack_fffffffffffffb10);
  local_3c0 = local_250;
  local_3c8._M_cur =
       (__node_type *)
       std::
       unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
       ::begin(in_stack_fffffffffffffaf8);
  local_3d0._M_cur =
       (__node_type *)
       std::
       unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
       ::end(in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_3c8,&local_3d0);
    if (!bVar1) break;
    phVar6 = std::__detail::_Node_iterator<handlegraph::handle_t,_true,_true>::operator*
                       ((_Node_iterator<handlegraph::handle_t,_true,_true> *)0x284cc5);
    lVar12 = *(long *)(*local_10 + -0x1e0);
    lVar7 = (long)local_10 + lVar12;
    plVar2 = local_10;
    local_3d8 = phVar6;
    pvVar8 = std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::front
                       (in_stack_fffffffffffffb00);
    (**(code **)(*(long *)((long)plVar2 + lVar12) + 0x108))(lVar7,phVar6,pvVar8);
    std::__detail::_Node_iterator<handlegraph::handle_t,_true,_true>::operator++
              ((_Node_iterator<handlegraph::handle_t,_true,_true> *)in_stack_fffffffffffffb00);
  }
  local_3e0 = local_2a8;
  local_3e8._M_cur =
       (__node_type *)
       std::
       unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
       ::begin(in_stack_fffffffffffffaf8);
  local_3f0._M_cur =
       (__node_type *)
       std::
       unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
       ::end(in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_3e8,&local_3f0);
    if (!bVar1) break;
    local_3f8 = std::__detail::_Node_iterator<handlegraph::handle_t,_true,_true>::operator*
                          ((_Node_iterator<handlegraph::handle_t,_true,_true> *)0x284dbc);
    lVar12 = *(long *)(*local_10 + -0x1e0);
    lVar7 = (long)local_10 + lVar12;
    plVar2 = local_10;
    pvVar8 = std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::back
                       (in_stack_fffffffffffffb00);
    (**(code **)(*(long *)((long)plVar2 + lVar12) + 0x108))(lVar7,pvVar8,local_3f8);
    std::__detail::_Node_iterator<handlegraph::handle_t,_true,_true>::operator++
              ((_Node_iterator<handlegraph::handle_t,_true,_true> *)in_stack_fffffffffffffb00);
  }
  local_408._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                  in_stack_fffffffffffffaf8);
  local_400._M_current = local_408._M_current;
  __gnu_cxx::
  __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  ::operator++(&local_408);
  while( true ) {
    local_410 = (handle_t *)
                std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                          ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                           in_stack_fffffffffffffaf8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffaf8);
    if (!bVar1) break;
    in_stack_fffffffffffffaf8 =
         *(unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
           **)(*local_10 + -0x1e0);
    in_stack_fffffffffffffb00 =
         (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
         ((long)local_10 + (long)in_stack_fffffffffffffaf8);
    plVar2 = local_10;
    phVar10 = __gnu_cxx::
              __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
              ::operator*(&local_400);
    phVar9 = __gnu_cxx::
             __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
             ::operator*(&local_408);
    (**(code **)(*(long *)((long)plVar2 + (long)in_stack_fffffffffffffaf8) + 0x108))
              (in_stack_fffffffffffffb00,phVar10,phVar9);
    local_400._M_current = local_408._M_current;
    __gnu_cxx::
    __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_408);
  }
  local_418 = local_18;
  local_420._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                  in_stack_fffffffffffffaf8);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
             in_stack_fffffffffffffaf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffb00,
                       (__normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                        *)in_stack_fffffffffffffaf8);
    if (!bVar1) break;
    phVar10 = __gnu_cxx::
              __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
              ::operator*(&local_420);
    (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1e0)) + 0xf8))
              ((long)local_10 + *(long *)(*local_10 + -0x1e0),phVar10);
    __gnu_cxx::
    __normal_iterator<const_handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_420);
  }
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::~unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                    *)0x284fd7);
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::~unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                    *)0x284fe4);
  hVar11.data[0] = local_8[0];
  hVar11.data[1] = local_8[1];
  hVar11.data[2] = local_8[2];
  hVar11.data[3] = local_8[3];
  hVar11.data[4] = local_8[4];
  hVar11.data[5] = local_8[5];
  hVar11.data[6] = local_8[6];
  hVar11.data[7] = local_8[7];
  return (handle_t)hVar11.data;
}

Assistant:

handle_t concat_nodes(MutablePathDeletableHandleGraph& graph, const std::vector<handle_t>& nodes) {
    
    // Make sure we have at least 2 nodes
    assert(!nodes.empty() && nodes.front() != nodes.back());
    
    // We also require no edges enter or leave the run of nodes, but we can't check that now.
    
    // Make the new node
    handle_t new_node;
    {
        std::stringstream ss;
        for (auto& n : nodes) {
            ss << graph.get_sequence(n);
        }
        
        new_node = graph.create_handle(ss.str());
    }
    
#ifdef debug
    std::cerr << "Concatenating ";
    for (auto& n : nodes) {
        std::cerr << graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << " ";
    }
    std::cerr << "into " << graph.get_id(new_node) << "+" << std::endl;
#endif
    
    // We should be able to rely on our handle graph to deduplicate edges, but see https://github.com/vgteam/libbdsg/issues/39
    // So we deduplicate ourselves.
    
    // Find all the neighbors. Make sure to translate edges to the other end of
    // the run, or self loops.
    std::unordered_set<handle_t> left_neighbors;
    graph.follow_edges(nodes.front(), true, [&](const handle_t& left_neighbor) {
        if (left_neighbor == nodes.back()) {
            // Loop back to the end
            left_neighbors.insert(new_node);
        } else if (left_neighbor == graph.flip(nodes.front())) {
            // Loop back to the front
            left_neighbors.insert(graph.flip(new_node));
        } else {
            // Normal edge
            left_neighbors.insert(left_neighbor);
        }
    });
    
    std::unordered_set<handle_t> right_neighbors;
    graph.follow_edges(nodes.back(), false, [&](const handle_t& right_neighbor) {
        if (right_neighbor == nodes.front()) {
            // Loop back to the front.
            // We will have seen it from the other side, so ignore it here.
        } else if (right_neighbor == graph.flip(nodes.back())) {
            // Loop back to the end
            right_neighbors.insert(graph.flip(new_node));
        } else {
            // Normal edge
            right_neighbors.insert(right_neighbor);
        }
    });
    
    // Make all the edges, now that we can't interfere with edge listing
    for (auto& n : left_neighbors) {
#ifdef debug
        std::cerr << "Creating edge " << graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << " -> "
        <<  graph.get_id(new_node) << (graph.get_is_reverse(new_node) ? "-" : "+") << std::endl;
#endif
        graph.create_edge(n, new_node);
    }
    for (auto& n : right_neighbors) {
        
#ifdef debug
        std::cerr << "Creating edge " << graph.get_id(new_node) << (graph.get_is_reverse(new_node) ? "-" : "+") << " -> "
        <<  graph.get_id(n) << (graph.get_is_reverse(n) ? "-" : "+") << std::endl;
#endif
        
        graph.create_edge(new_node, n);
    }
    
    {
        // Collect the first and last visits along paths. TODO: this requires
        // walking each path all the way through.
        //
        // This contains the first and last handles in path orientation, and a flag
        // for if the path runs along the reverse strand of our run of nodes.
        std::vector<std::tuple<step_handle_t, step_handle_t, bool>> ranges_to_rewrite;
        
        graph.for_each_step_on_handle(nodes.front(), [&](const step_handle_t& front_step) {
            auto path = graph.get_path_handle_of_step(front_step);
#ifdef debug
            std::cerr << "Consider path " << graph.get_path_name(path) << std::endl;
#endif
            
            // If we don't get the same oriented node as where this step is
            // stepping, we must be stepping on the other orientation.
            bool runs_reverse = (graph.get_handle_of_step(front_step) != nodes.front());
            
            step_handle_t back_step = front_step;
            
            while (graph.get_handle_of_step(back_step) !=
                   (runs_reverse ? graph.flip(nodes.back()) : nodes.back())) {
                // Until we find the step on the path that visits the last node in our run.
                // Go along the path towards where our last node should be, in our forward orientation.
                back_step = runs_reverse ? graph.get_previous_step(back_step) : graph.get_next_step(back_step);
            }
            
            // Now we can record the range to rewrite
            // Make sure to put it into path-forward order
            if (runs_reverse) {
#ifdef debug
                std::cerr << "\tGoing to rewrite between " << graph.get_id(graph.get_handle_of_step(front_step)) << " and " << graph.get_id(graph.get_handle_of_step(back_step)) << " backward" << std::endl;
#endif
                ranges_to_rewrite.emplace_back(back_step, front_step, true);
            } else {
                
#ifdef debug
                std::cerr << "\tGoing to rewrite between " << graph.get_id(graph.get_handle_of_step(front_step)) << " and " << graph.get_id(graph.get_handle_of_step(back_step)) << std::endl;
#endif
                ranges_to_rewrite.emplace_back(front_step, back_step, false);
            }
        });
        
        uint64_t i = 0;
        for (auto& range : ranges_to_rewrite) {
            // Rewrite each range to visit the new node in the appropriate orientation instead of whatever it did before
            // Make sure to advance the end of the range because rewrite is end-exclusive (to allow insert).
            graph.rewrite_segment(std::get<0>(range), std::get<1>(range),
                                  {std::get<2>(range) ? graph.flip(new_node) : new_node});
        }
    }
    
    // Destroy all the old edges
    // We know they only exist to the left and right neighbors, and along the run
    for (auto& n : left_neighbors) {
        graph.destroy_edge(n, nodes.front());
    }
    for (auto& n : right_neighbors) {
        graph.destroy_edge(nodes.back(), n);
    }
    auto it = nodes.begin();
    auto next_it = it;
    ++next_it;
    while (next_it != nodes.end()) {
        graph.destroy_edge(*it, *next_it);
        it = next_it;
        ++next_it;
    }
    
    for (auto& n : nodes) {
        // Destroy all the old nodes
#ifdef debug
        std::cerr << "Destroying node " << graph.get_id(n) << std::endl;
#endif
        graph.destroy_handle(n);
    }
    
    /*
     #ifdef debug
     std::cerr << "Paths after concat: " << std::endl;
     graph.for_each_path_handle([&](const path_handle_t p) {
     std::cerr << graph.get_path_name(p) << ": ";
     for (auto h : graph.scan_path(p)) {
     std::cerr << graph.get_id(h) << (graph.get_is_reverse(h) ? '-' : '+') << " ";
     }
     std::cerr << std::endl;
     });
     #endif
     */
    
    // Return the new handle we merged to.
    return new_node;
}